

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardVariableSpecification.cpp
# Opt level: O2

int __thiscall
DIS::StandardVariableSpecification::getMarshalledSize(StandardVariableSpecification *this)

{
  pointer pSVar1;
  undefined8 uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int local_a4;
  SimulationManagementPduHeader listElement;
  
  local_a4 = 2;
  lVar5 = 0x58;
  uVar4 = 0;
  while( true ) {
    pSVar1 = (this->_standardVariables).
             super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_standardVariables).
                       super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x60) <= uVar4)
    break;
    listElement._vptr_SimulationManagementPduHeader =
         (_func_int **)&PTR__SimulationManagementPduHeader_001c3098;
    listElement._pduHeader._vptr_PduHeader = (_func_int **)&PTR__PduHeader_001c27b0;
    uVar2 = *(undefined8 *)((long)pSVar1 + lVar5 + -0x48);
    listElement._pduHeader._16_5_ =
         SUB85((ulong)*(undefined8 *)((long)pSVar1 + lVar5 + -0x43) >> 0x18,0);
    listElement._pduHeader._8_5_ = SUB85(uVar2,0);
    listElement._pduHeader._timestamp._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
    listElement._originatingID._vptr_EntityID = (_func_int **)&PTR__EntityID_001c15b0;
    listElement._originatingID._simulationAddress._vptr_SimulationAddress =
         (_func_int **)&PTR__SimulationAddress_001c2fb8;
    listElement._originatingID._simulationAddress._8_4_ =
         *(undefined4 *)((long)pSVar1 + lVar5 + -0x28);
    listElement._originatingID._entityNumber = *(unsigned_short *)((long)pSVar1 + lVar5 + -0x20);
    listElement._recevingID._vptr_EntityID = (_func_int **)&PTR__EntityID_001c15b0;
    listElement._recevingID._simulationAddress._vptr_SimulationAddress =
         (_func_int **)&PTR__SimulationAddress_001c2fb8;
    listElement._recevingID._simulationAddress._8_4_ = *(undefined4 *)((long)pSVar1 + lVar5 + -8);
    listElement._recevingID._entityNumber =
         *(unsigned_short *)((long)&pSVar1->_vptr_SimulationManagementPduHeader + lVar5);
    iVar3 = SimulationManagementPduHeader::getMarshalledSize(&listElement);
    local_a4 = local_a4 + iVar3;
    SimulationManagementPduHeader::~SimulationManagementPduHeader(&listElement);
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x60;
  }
  return local_a4;
}

Assistant:

int StandardVariableSpecification::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 2;  // _numberOfStandardVariableRecords

   for(unsigned long long idx=0; idx < _standardVariables.size(); idx++)
   {
        SimulationManagementPduHeader listElement = _standardVariables[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}